

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_parse_url_path(Curl_easy *data)

{
  _Bool _Var1;
  CURLcode CVar2;
  int iVar3;
  bool bVar4;
  size_t local_58;
  size_t valuelen;
  char *value;
  char *name;
  char *end;
  char *ptr;
  char *begin;
  IMAP *imap;
  Curl_easy *pCStack_18;
  CURLcode result;
  Curl_easy *data_local;
  
  imap._4_4_ = CURLE_OK;
  begin = (char *)(data->req).p.ldap;
  end = (data->state).up.path + 1;
  ptr = end;
  pCStack_18 = data;
  while (_Var1 = imap_is_bchar(*end), _Var1) {
    end = end + 1;
  }
  if (end == ptr) {
    begin[8] = '\0';
    begin[9] = '\0';
    begin[10] = '\0';
    begin[0xb] = '\0';
    begin[0xc] = '\0';
    begin[0xd] = '\0';
    begin[0xe] = '\0';
    begin[0xf] = '\0';
  }
  else {
    name = end;
    if ((ptr < end) && (end[-1] == '/')) {
      name = end + -1;
    }
    CVar2 = Curl_urldecode(ptr,(long)name - (long)ptr,(char **)(begin + 8),(size_t *)0x0,REJECT_CTRL
                          );
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    imap._4_4_ = CURLE_OK;
  }
  while( true ) {
    if (*end != ';') {
      if (((*(long *)(begin + 8) != 0) && (*(long *)(begin + 0x18) == 0)) &&
         (*(long *)(begin + 0x20) == 0)) {
        curl_url_get((pCStack_18->state).uh,CURLUPART_QUERY,(char **)(begin + 0x38),0x40);
      }
      if (*end == '\0') {
        data_local._4_4_ = CURLE_OK;
      }
      else {
        data_local._4_4_ = CURLE_URL_MALFORMAT;
      }
      return data_local._4_4_;
    }
    ptr = end + 1;
    end = ptr;
    while( true ) {
      bVar4 = false;
      if (*end != '\0') {
        bVar4 = *end != '=';
      }
      if (!bVar4) break;
      end = end + 1;
    }
    if (*end == '\0') {
      return CURLE_URL_MALFORMAT;
    }
    CVar2 = Curl_urldecode(ptr,(long)end - (long)ptr,&value,(size_t *)0x0,REJECT_CTRL);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    end = end + 1;
    imap._4_4_ = 0;
    ptr = end;
    while (_Var1 = imap_is_bchar(*end), _Var1) {
      end = end + 1;
    }
    imap._4_4_ = Curl_urldecode(ptr,(long)end - (long)ptr,(char **)&valuelen,&local_58,REJECT_CTRL);
    if (imap._4_4_ != CURLE_OK) break;
    iVar3 = curl_strequal(value,"UIDVALIDITY");
    if ((iVar3 == 0) || (*(long *)(begin + 0x10) != 0)) {
      iVar3 = curl_strequal(value,"UID");
      if ((iVar3 == 0) || (*(long *)(begin + 0x18) != 0)) {
        iVar3 = curl_strequal(value,"MAILINDEX");
        if ((iVar3 == 0) || (*(long *)(begin + 0x20) != 0)) {
          iVar3 = curl_strequal(value,"SECTION");
          if ((iVar3 == 0) || (*(long *)(begin + 0x28) != 0)) {
            iVar3 = curl_strequal(value,"PARTIAL");
            if ((iVar3 == 0) || (*(long *)(begin + 0x30) != 0)) {
              (*Curl_cfree)(value);
              (*Curl_cfree)((void *)valuelen);
              return CURLE_URL_MALFORMAT;
            }
            if ((local_58 != 0) && (*(char *)(valuelen + (local_58 - 1)) == '/')) {
              *(undefined1 *)(valuelen + (local_58 - 1)) = 0;
            }
            *(size_t *)(begin + 0x30) = valuelen;
          }
          else {
            if ((local_58 != 0) && (*(char *)(valuelen + (local_58 - 1)) == '/')) {
              *(undefined1 *)(valuelen + (local_58 - 1)) = 0;
            }
            *(size_t *)(begin + 0x28) = valuelen;
          }
        }
        else {
          if ((local_58 != 0) && (*(char *)(valuelen + (local_58 - 1)) == '/')) {
            *(undefined1 *)(valuelen + (local_58 - 1)) = 0;
          }
          *(size_t *)(begin + 0x20) = valuelen;
        }
      }
      else {
        if ((local_58 != 0) && (*(char *)(valuelen + (local_58 - 1)) == '/')) {
          *(undefined1 *)(valuelen + (local_58 - 1)) = 0;
        }
        *(size_t *)(begin + 0x18) = valuelen;
      }
    }
    else {
      if ((local_58 != 0) && (*(char *)(valuelen + (local_58 - 1)) == '/')) {
        *(undefined1 *)(valuelen + (local_58 - 1)) = 0;
      }
      *(size_t *)(begin + 0x10) = valuelen;
    }
    valuelen = 0;
    (*Curl_cfree)(value);
    (*Curl_cfree)((void *)valuelen);
  }
  (*Curl_cfree)(value);
  return imap._4_4_;
}

Assistant:

static CURLcode imap_parse_url_path(struct Curl_easy *data)
{
  /* The imap struct is already initialised in imap_connect() */
  CURLcode result = CURLE_OK;
  struct IMAP *imap = data->req.p.imap;
  const char *begin = &data->state.up.path[1]; /* skip leading slash */
  const char *ptr = begin;

  /* See how much of the URL is a valid path and decode it */
  while(imap_is_bchar(*ptr))
    ptr++;

  if(ptr != begin) {
    /* Remove the trailing slash if present */
    const char *end = ptr;
    if(end > begin && end[-1] == '/')
      end--;

    result = Curl_urldecode(begin, end - begin, &imap->mailbox, NULL,
                            REJECT_CTRL);
    if(result)
      return result;
  }
  else
    imap->mailbox = NULL;

  /* There can be any number of parameters in the form ";NAME=VALUE" */
  while(*ptr == ';') {
    char *name;
    char *value;
    size_t valuelen;

    /* Find the length of the name parameter */
    begin = ++ptr;
    while(*ptr && *ptr != '=')
      ptr++;

    if(!*ptr)
      return CURLE_URL_MALFORMAT;

    /* Decode the name parameter */
    result = Curl_urldecode(begin, ptr - begin, &name, NULL,
                            REJECT_CTRL);
    if(result)
      return result;

    /* Find the length of the value parameter */
    begin = ++ptr;
    while(imap_is_bchar(*ptr))
      ptr++;

    /* Decode the value parameter */
    result = Curl_urldecode(begin, ptr - begin, &value, &valuelen,
                            REJECT_CTRL);
    if(result) {
      free(name);
      return result;
    }

    DEBUGF(infof(data, "IMAP URL parameter '%s' = '%s'", name, value));

    /* Process the known hierarchical parameters (UIDVALIDITY, UID, SECTION and
       PARTIAL) stripping of the trailing slash character if it is present.

       Note: Unknown parameters trigger a URL_MALFORMAT error. */
    if(strcasecompare(name, "UIDVALIDITY") && !imap->uidvalidity) {
      if(valuelen > 0 && value[valuelen - 1] == '/')
        value[valuelen - 1] = '\0';

      imap->uidvalidity = value;
      value = NULL;
    }
    else if(strcasecompare(name, "UID") && !imap->uid) {
      if(valuelen > 0 && value[valuelen - 1] == '/')
        value[valuelen - 1] = '\0';

      imap->uid = value;
      value = NULL;
    }
    else if(strcasecompare(name, "MAILINDEX") && !imap->mindex) {
      if(valuelen > 0 && value[valuelen - 1] == '/')
        value[valuelen - 1] = '\0';

      imap->mindex = value;
      value = NULL;
    }
    else if(strcasecompare(name, "SECTION") && !imap->section) {
      if(valuelen > 0 && value[valuelen - 1] == '/')
        value[valuelen - 1] = '\0';

      imap->section = value;
      value = NULL;
    }
    else if(strcasecompare(name, "PARTIAL") && !imap->partial) {
      if(valuelen > 0 && value[valuelen - 1] == '/')
        value[valuelen - 1] = '\0';

      imap->partial = value;
      value = NULL;
    }
    else {
      free(name);
      free(value);

      return CURLE_URL_MALFORMAT;
    }

    free(name);
    free(value);
  }

  /* Does the URL contain a query parameter? Only valid when we have a mailbox
     and no UID as per RFC-5092 */
  if(imap->mailbox && !imap->uid && !imap->mindex) {
    /* Get the query parameter, URL decoded */
    (void)curl_url_get(data->state.uh, CURLUPART_QUERY, &imap->query,
                       CURLU_URLDECODE);
  }

  /* Any extra stuff at the end of the URL is an error */
  if(*ptr)
    return CURLE_URL_MALFORMAT;

  return CURLE_OK;
}